

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer(TPZTransfer<std::complex<float>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZBlock *this_00;
  TPZRegisterClassId *size;
  TPZManVector<std::complex<float>,_10> *unaff_retaddr;
  int64_t in_stack_ffffffffffffff98;
  TPZVec<int> *in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffffb0;
  TPZBlock *in_stack_ffffffffffffffc0;
  TPZRegisterClassId *size_00;
  
  size_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZTransfer<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__TPZTransfer_023eec30;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  TPZBlock::TPZBlock(in_stack_ffffffffffffffc0);
  this_00 = (TPZBlock *)(in_RDI + 0xf0);
  TPZBlock::TPZBlock(this_00);
  size = in_RDI + 0x1c0;
  TPZVec<int>::TPZVec(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZVec<int>::TPZVec(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  TPZManVector<int,_10>::TPZManVector((TPZManVector<int,_10> *)this_00,(int64_t)size);
  TPZManVector<int,_10>::TPZManVector((TPZManVector<int,_10> *)this_00,(int64_t)size);
  *(undefined4 *)(in_RDI + 0x290) = 0;
  TPZManVector<std::complex<float>,_10>::TPZManVector(unaff_retaddr,(int64_t)size_00);
  *(undefined4 *)(in_RDI + 0x308) = 0;
  return;
}

Assistant:

TPZTransfer<TVar>::TPZTransfer() : TPZRegisterClassId(&TPZTransfer::ClassId),
fNTVarVar(0),fRowBlock(),fColBlock(),fColPosition(0),fNumberofColumnBlocks(0),fColumnBlockPosition(0),
fColumnBlockNumber(0),fColumnBlockLastUsed(0),fDoubleValues(0),fDoubleValLastUsed(0) {
}